

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupWithNewPo(Gia_Man_t *p1,Gia_Man_t *p2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  bool bVar7;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *pTemp;
  Gia_Man_t *p2_local;
  Gia_Man_t *p1_local;
  
  iVar1 = Gia_ManRegNum(p2);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p2) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                  ,0x91e,"Gia_Man_t *Gia_ManDupWithNewPo(Gia_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Gia_ManPiNum(p2);
  iVar2 = Gia_ManRegNum(p1);
  if (iVar1 != iVar2) {
    __assert_fail("Gia_ManPiNum(p2) == Gia_ManRegNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                  ,0x922,"Gia_Man_t *Gia_ManDupWithNewPo(Gia_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Gia_ManObjNum(p1);
  iVar2 = Gia_ManObjNum(p2);
  p = Gia_ManStart(iVar1 + iVar2);
  pcVar4 = Abc_UtilStrsav(p1->pName);
  p->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p1->pSpec);
  p->pSpec = pcVar4;
  Gia_ManHashAlloc(p);
  pGVar5 = Gia_ManConst0(p1);
  pGVar5->Value = 0;
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p1->vCis);
    bVar7 = false;
    if (local_34 < iVar1) {
      pGStack_30 = Gia_ManCi(p1,local_34);
      bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar3 = Gia_ManAppendCi(p);
    pGStack_30->Value = uVar3;
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    bVar7 = false;
    if (local_34 < p1->nObjs) {
      pGStack_30 = Gia_ManObj(p1,local_34);
      bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(pGStack_30);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_30);
      iVar2 = Gia_ObjFanin1Copy(pGStack_30);
      uVar3 = Gia_ManHashAnd(p,iVar1,iVar2);
      pGStack_30->Value = uVar3;
    }
    local_34 = local_34 + 1;
  }
  pGVar5 = Gia_ManConst0(p2);
  pGVar5->Value = 0;
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p2);
    bVar7 = false;
    if (local_34 < iVar1) {
      pGStack_30 = Gia_ManCi(p2,local_34);
      bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    pGVar5 = Gia_ManRo(p1,local_34);
    pGStack_30->Value = pGVar5->Value;
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    bVar7 = false;
    if (local_34 < p2->nObjs) {
      pGStack_30 = Gia_ManObj(p2,local_34);
      bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(pGStack_30);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_30);
      iVar2 = Gia_ObjFanin1Copy(pGStack_30);
      uVar3 = Gia_ManHashAnd(p,iVar1,iVar2);
      pGStack_30->Value = uVar3;
    }
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p2);
    bVar7 = false;
    if (local_34 < iVar1) {
      pGStack_30 = Gia_ManCo(p2,local_34);
      bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_30);
    Gia_ManAppendCo(p,iVar1);
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p1);
    bVar7 = false;
    if (local_34 < iVar1) {
      iVar1 = Gia_ManPoNum(p1);
      pGStack_30 = Gia_ManCo(p1,iVar1 + local_34);
      bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_30);
    Gia_ManAppendCo(p,iVar1);
    local_34 = local_34 + 1;
  }
  Gia_ManHashStop(p);
  iVar1 = Gia_ManRegNum(p1);
  Gia_ManSetRegNum(p,iVar1);
  pGVar6 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupWithNewPo( Gia_Man_t * p1, Gia_Man_t * p2 )
{
    Gia_Man_t * pTemp, * pNew;
    Gia_Obj_t * pObj;
    int i;
    // there is no flops in p2
    assert( Gia_ManRegNum(p2) == 0 );
    // there is only one PO in p2
//    assert( Gia_ManPoNum(p2) == 1 );
    // input count of p2 is equal to flop count of p1 
    assert( Gia_ManPiNum(p2) == Gia_ManRegNum(p1) );

    // start new AIG
    pNew = Gia_ManStart( Gia_ManObjNum(p1)+Gia_ManObjNum(p2) );
    pNew->pName = Abc_UtilStrsav( p1->pName );
    pNew->pSpec = Abc_UtilStrsav( p1->pSpec );
    Gia_ManHashAlloc( pNew );
    // dup first AIG
    Gia_ManConst0(p1)->Value = 0;
    Gia_ManForEachCi( p1, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p1, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // dup second AIG
    Gia_ManConst0(p2)->Value = 0;
    Gia_ManForEachPi( p2, pObj, i )
        pObj->Value = Gia_ManRo(p1, i)->Value;
    Gia_ManForEachAnd( p2, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // add property output
    Gia_ManForEachPo( p2, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // add flop inputs
    Gia_ManForEachRi( p1, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p1) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}